

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

IRType rec_next_types(GCtab *t,uint32_t idx)

{
  long *plVar1;
  Node *n;
  cTValue *a;
  uint32_t idx_local;
  GCtab *t_local;
  uint local_2c;
  uint local_1c;
  uint local_c;
  
  for (a._4_4_ = idx; a._4_4_ < t->asize; a._4_4_ = a._4_4_ + 1) {
    plVar1 = (long *)((t->array).ptr64 + (ulong)a._4_4_ * 8);
    if (*plVar1 != -1) {
      if ((uint)(*plVar1 >> 0x2f) < 0xfffffff2) {
        local_c = 0xe;
      }
      else {
        local_c = (uint)(*plVar1 >> 0x2f) ^ 0xffffffff;
      }
      return local_c * 0x100 + IRT_NUM;
    }
  }
  a._4_4_ = a._4_4_ - t->asize;
  while( true ) {
    if (t->hmask < a._4_4_) {
      return IRT_NIL;
    }
    plVar1 = (long *)((t->node).ptr64 + (ulong)a._4_4_ * 0x18);
    if (*plVar1 != -1) break;
    a._4_4_ = a._4_4_ + 1;
  }
  if ((uint)(plVar1[1] >> 0x2f) < 0xfffffff2) {
    local_1c = 0xe;
  }
  else {
    local_1c = (uint)(plVar1[1] >> 0x2f) ^ 0xffffffff;
  }
  if ((uint)(*plVar1 >> 0x2f) < 0xfffffff2) {
    local_2c = 0xe;
  }
  else {
    local_2c = (uint)(*plVar1 >> 0x2f) ^ 0xffffffff;
  }
  return local_1c + local_2c * 0x100;
}

Assistant:

static IRType rec_next_types(GCtab *t, uint32_t idx)
{
  for (; idx < t->asize; idx++) {
    cTValue *a = arrayslot(t, idx);
    if (LJ_LIKELY(!tvisnil(a)))
      return (LJ_DUALNUM ? IRT_INT : IRT_NUM) + (itype2irt(a) << 8);
  }
  idx -= t->asize;
  for (; idx <= t->hmask; idx++) {
    Node *n = &noderef(t->node)[idx];
    if (!tvisnil(&n->val))
      return itype2irt(&n->key) + (itype2irt(&n->val) << 8);
  }
  return IRT_NIL + (IRT_NIL << 8);
}